

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O0

char * spovar2str(long spovar)

{
  char *pcVar1;
  char *pcStack_18;
  int is_array;
  char *n;
  long spovar_local;
  
  pcStack_18 = (char *)0x0;
  n = (char *)(spovar & 0xffffffffffffffbf);
  switch(n) {
  case (char *)0x1:
    pcStack_18 = "integer";
    break;
  case (char *)0x2:
    pcStack_18 = "string";
    break;
  case (char *)0x3:
    pcStack_18 = "variable";
    break;
  case (char *)0x4:
    pcStack_18 = "coordinate";
    break;
  case (char *)0x5:
    pcStack_18 = "region";
    break;
  case (char *)0x6:
    pcStack_18 = "mapchar";
    break;
  case (char *)0x7:
    pcStack_18 = "monster";
    break;
  case (char *)0x8:
    pcStack_18 = "object";
    break;
  default:
    lc_error("spovar2str(%li)",n);
  }
  spovar2str::togl = (spovar2str::togl + 1) % 2;
  pcVar1 = "";
  if ((spovar & 0x40U) != 0) {
    pcVar1 = " array";
  }
  snprintf(spovar2str::buf[spovar2str::togl],0x7f,"%s%s",pcStack_18,pcVar1);
  return spovar2str::buf[spovar2str::togl];
}

Assistant:

static const char *spovar2str(long spovar)
{
	static int togl = 0;
	static char buf[2][128];
	char *n = NULL;
	int is_array = (spovar & SPOVAR_ARRAY);
	spovar &= ~SPOVAR_ARRAY;

	switch (spovar) {
	default:		lc_error("spovar2str(%li)", spovar); break;
	case SPOVAR_INT:	n = "integer"; break;
	case SPOVAR_STRING:	n = "string"; break;
	case SPOVAR_VARIABLE:	n = "variable"; break;
	case SPOVAR_COORD:	n = "coordinate"; break;
	case SPOVAR_REGION:	n = "region"; break;
	case SPOVAR_MAPCHAR:	n = "mapchar"; break;
	case SPOVAR_MONST:	n = "monster"; break;
	case SPOVAR_OBJ:	n = "object"; break;
	}

	togl = (togl + 1) % 2;

	snprintf(buf[togl], 127, "%s%s", n, (is_array ? " array" : ""));
	return buf[togl];
}